

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

void __thiscall helics::apps::WebServer::stopServer(WebServer *this)

{
  size_t *psVar1;
  impl_type *piVar2;
  reactor *prVar3;
  byte bVar4;
  int iVar5;
  bool bVar6;
  string_view message;
  uint32_t local_24;
  select_interrupter *local_20;
  
  LOCK();
  bVar6 = (this->running)._M_base._M_i == true;
  if (bVar6) {
    (this->running)._M_base._M_i = false;
  }
  UNLOCK();
  if (bVar6) {
    message._M_str = "stopping broker web server";
    message._M_len = 0x1a;
    TypedBrokerServer::logMessage(message);
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->threadGuard);
    if (iVar5 != 0) {
      std::__throw_system_error(iVar5);
    }
    piVar2 = (((this->context).
               super___shared_ptr<helics::apps::IocWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ioc
             ).impl_;
    bVar6 = (piVar2->mutex_).enabled_;
    bVar4 = bVar6;
    if (bVar6 == true) {
      pthread_mutex_lock((pthread_mutex_t *)&(piVar2->mutex_).mutex_);
      bVar4 = (piVar2->mutex_).enabled_;
    }
    piVar2->stopped_ = true;
    if ((bVar4 & 1) != 0) {
      psVar1 = &(piVar2->wakeup_event_).event_.state_;
      *(byte *)psVar1 = (byte)*psVar1 | 1;
      pthread_cond_broadcast((pthread_cond_t *)&(piVar2->wakeup_event_).event_);
    }
    if ((piVar2->task_interrupted_ == false) && (prVar3 = piVar2->task_, prVar3 != (reactor *)0x0))
    {
      piVar2->task_interrupted_ = true;
      local_24 = 0x80000009;
      local_20 = &prVar3->interrupter_;
      epoll_ctl(prVar3->epoll_fd_,3,(prVar3->interrupter_).read_descriptor_,(epoll_event *)&local_24
               );
    }
    if (bVar6 != false) {
      pthread_mutex_unlock((pthread_mutex_t *)&(piVar2->mutex_).mutex_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadGuard);
  }
  return;
}

Assistant:

void WebServer::stopServer()
{
    bool exp{true};
    if (running.compare_exchange_strong(exp, false)) {
        logMessage("stopping broker web server");
        const std::lock_guard<std::mutex> tlock(threadGuard);
        context->ioc.stop();
    }
}